

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

void __thiscall Catch::AssertionStats::AssertionStats(AssertionStats *this,AssertionStats *param_1)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  
  AssertionResult::AssertionResult(&this->assertionResult,&param_1->assertionResult);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&this->infoMessages,&param_1->infoMessages);
  uVar1 = (param_1->totals).assertions.passed;
  uVar2 = (param_1->totals).assertions.failed;
  uVar3 = (param_1->totals).assertions.failedButOk;
  uVar4 = (param_1->totals).assertions.skipped;
  uVar5 = (param_1->totals).testCases.passed;
  uVar6 = (param_1->totals).testCases.failed;
  uVar7 = (param_1->totals).testCases.skipped;
  (this->totals).testCases.failedButOk = (param_1->totals).testCases.failedButOk;
  (this->totals).testCases.skipped = uVar7;
  (this->totals).testCases.passed = uVar5;
  (this->totals).testCases.failed = uVar6;
  (this->totals).assertions.failedButOk = uVar3;
  (this->totals).assertions.skipped = uVar4;
  (this->totals).assertions.passed = uVar1;
  (this->totals).assertions.failed = uVar2;
  return;
}

Assistant:

AssertionStats( AssertionStats const& )              = default;